

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lefreader.cpp
# Opt level: O1

bool __thiscall LEFReader::parseLayerMaxWidth(LEFReader *this)

{
  string *tokstr;
  int iVar1;
  int *__nptr;
  token_t tVar2;
  int *piVar3;
  undefined8 uVar4;
  bool bVar5;
  string maxwidth;
  string local_78;
  double local_58;
  int *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_48 = 0;
  local_40 = 0;
  tokstr = &this->m_tokstr;
  local_50 = (int *)&local_40;
  tVar2 = tokenize(this,tokstr);
  this->m_curtok = tVar2;
  if (tVar2 == TOK_NUMBER) {
    std::__cxx11::string::_M_assign((string *)&local_50);
    tVar2 = tokenize(this,tokstr);
    this->m_curtok = tVar2;
    if (tVar2 == TOK_SEMICOL) {
      tVar2 = tokenize(this,tokstr);
      __nptr = local_50;
      this->m_curtok = tVar2;
      if (tVar2 == TOK_EOL) {
        piVar3 = __errno_location();
        iVar1 = *piVar3;
        *piVar3 = 0;
        local_58 = strtod((char *)__nptr,(char **)&local_78);
        if ((int *)local_78._M_dataplus._M_p == __nptr) {
          uVar4 = std::__throw_invalid_argument("stod");
          if ((int *)local_78._M_dataplus._M_p != piVar3) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          if (local_50 != (int *)&local_40) {
            operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
          }
          _Unwind_Resume(uVar4);
        }
        if (*piVar3 == 0) {
          *piVar3 = iVar1;
        }
        else if (*piVar3 == 0x22) {
          std::__throw_out_of_range("stod");
          goto LAB_0012ef93;
        }
        bVar5 = true;
        (*this->_vptr_LEFReader[0x13])(local_58,this);
        goto LAB_0012f03a;
      }
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Expected an EOL\n","");
      error(this,&local_78);
    }
    else {
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"Expected a semicolon in layer max width\n","");
      error(this,&local_78);
    }
  }
  else {
LAB_0012ef93:
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"Expected a number in layer max width\n","");
    error(this,&local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  bVar5 = false;
LAB_0012f03a:
  if (local_50 != (int *)&local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return bVar5;
}

Assistant:

bool LEFReader::parseLayerMaxWidth()
{
    std::string maxwidth;
    m_curtok = tokenize(m_tokstr);
    if (m_curtok != TOK_NUMBER)
    {
        error("Expected a number in layer max width\n");
        return false;    
    }

    maxwidth = m_tokstr;

    // expect ; 
    m_curtok = tokenize(m_tokstr);
    if (m_curtok != TOK_SEMICOL)
    {
        error("Expected a semicolon in layer max width\n");
        return false;
    }

    // expect EOL
    m_curtok = tokenize(m_tokstr);
    if (m_curtok != TOK_EOL)
    {
        error("Expected an EOL\n");
        return false;
    }

    double maxwidthd;
    try
    {
        maxwidthd = std::stod(maxwidth);
    }
    catch(const std::invalid_argument& ia)
    {
        error(ia.what());
    }

    onLayerMaxWidth(maxwidthd);

    return true;
}